

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barrier.hpp
# Opt level: O1

__pid_t __thiscall gmlc::concurrency::Barrier::wait(Barrier *this,void *__stat_loc)

{
  size_t *psVar1;
  size_t sVar2;
  __pid_t extraout_EAX;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->mtx;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  sVar2 = this->generation_;
  psVar1 = &this->count_;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 == 0) {
    this->generation_ = sVar2 + 1;
    this->count_ = this->threshold_;
    std::condition_variable::notify_all();
  }
  else {
    do {
      std::condition_variable::wait((unique_lock *)&this->cv);
    } while (this->generation_ == sVar2);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return extraout_EAX;
}

Assistant:

void wait()
        {
            std::unique_lock<std::mutex> lck(mtx);
            auto lGen = generation_;
            if (--count_ <= 0) {
                generation_++;
                count_ = threshold_;
                cv.notify_all();
            } else {
                cv.wait(lck, [this, lGen] { return lGen != generation_; });
            }
        }